

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

void __thiscall Lowerer::GenerateFastInlineArrayPop(Lowerer *this,Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  LabelInstr *labelHelper_00;
  LabelInstr *labelHelper;
  LabelInstr *pLStack_30;
  bool isLikelyNativeArray;
  LabelInstr *doneLabel;
  LabelInstr *bailOutLabelHelper;
  Opnd *arrayOpnd;
  Instr *instr_local;
  Lowerer *this_local;
  
  arrayOpnd = (Opnd *)instr;
  instr_local = (Instr *)this;
  if (instr->m_opcode != InlineArrayPop) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x4e80,"(instr->m_opcode == Js::OpCode::InlineArrayPop)",
                       "instr->m_opcode == Js::OpCode::InlineArrayPop");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bailOutLabelHelper = (LabelInstr *)IR::Instr::GetSrc1((Instr *)arrayOpnd);
  doneLabel = IR::LabelInstr::New(Label,this->m_func,true);
  pLStack_30 = IR::LabelInstr::New(Label,this->m_func,false);
  labelHelper._4_2_ =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
       IR::Opnd::GetValueType((Opnd *)bailOutLabelHelper);
  labelHelper._7_1_ = ValueType::IsLikelyNativeArray((ValueType *)((long)&labelHelper + 4));
  bVar2 = ShouldGenerateArrayFastPath(this,(Opnd *)bailOutLabelHelper,false,false,false);
  if (bVar2) {
    labelHelper_00 = IR::LabelInstr::New(Label,this->m_func,true);
    if ((labelHelper._7_1_ & 1) == 0) {
      GenerateFastPop(this,(Opnd *)bailOutLabelHelper,(Instr *)arrayOpnd,labelHelper_00,pLStack_30,
                      labelHelper_00);
    }
    else {
      GenerateFastPop(this,(Opnd *)bailOutLabelHelper,(Instr *)arrayOpnd,labelHelper_00,pLStack_30,
                      doneLabel);
    }
    IR::Instr::InsertBefore((Instr *)arrayOpnd,&labelHelper_00->super_Instr);
    InsertBranch(Br,true,pLStack_30,&labelHelper_00->super_Instr);
  }
  else if ((labelHelper._7_1_ & 1) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x4ea0,"(!isLikelyNativeArray)","!isLikelyNativeArray");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  IR::Instr::InsertAfter((Instr *)arrayOpnd,&pLStack_30->super_Instr);
  if ((labelHelper._7_1_ & 1) != 0) {
    LowerOneBailOutKind(this,(Instr *)arrayOpnd,BailOutConventionalNativeArrayAccessOnly,false,false
                       );
    IR::Instr::InsertAfter((Instr *)arrayOpnd,&doneLabel->super_Instr);
  }
  GenerateHelperToArrayPopFastPath(this,(Instr *)arrayOpnd,pLStack_30,doneLabel);
  return;
}

Assistant:

void
Lowerer::GenerateFastInlineArrayPop(IR::Instr * instr)
{
    Assert(instr->m_opcode == Js::OpCode::InlineArrayPop);

    IR::Opnd *arrayOpnd = instr->GetSrc1();

    IR::LabelInstr *bailOutLabelHelper = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, true);
    IR::LabelInstr *doneLabel = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);

    bool isLikelyNativeArray = arrayOpnd->GetValueType().IsLikelyNativeArray();

    if (ShouldGenerateArrayFastPath(arrayOpnd, false, false, false))
    {
        IR::LabelInstr *labelHelper = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, true);

        if(isLikelyNativeArray)
        {
            //We bailOut on cases like length == 0, Array Test failing cases (Runtime helper cannot handle these cases)
            GenerateFastPop(arrayOpnd, instr, labelHelper, doneLabel, bailOutLabelHelper);
        }
        else
        {
            //We jump to helper on cases like length == 0, Array Test failing cases
            GenerateFastPop(arrayOpnd, instr, labelHelper, doneLabel, labelHelper);
        }

        instr->InsertBefore(labelHelper);

        ///JMP to $doneLabel
        InsertBranch(Js::OpCode::Br, true, doneLabel, labelHelper);
    }
    else
    {
        //We assume here that the array will be a Var array. - Runtime Helper calls assume this.
        Assert(!isLikelyNativeArray);
    }

    instr->InsertAfter(doneLabel);

    if(isLikelyNativeArray)
    {
        //Lower IR::BailOutConventionalNativeArrayAccessOnly here.
        LowerOneBailOutKind(instr, IR::BailOutConventionalNativeArrayAccessOnly, false, false);
        instr->InsertAfter(bailOutLabelHelper);
    }

    GenerateHelperToArrayPopFastPath(instr, doneLabel, bailOutLabelHelper);
}